

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O2

void __thiscall
bssl::anon_unknown_0::SSLTest_ClientCAList_Test::TestBody(SSLTest_ClientCAList_Test *this)

{
  UniquePtr<struct_stack_st_X509_NAME> name_list;
  enable_if_t<_internal::StackTraits<stack_st_X509_NAME>::kIsConst,_bool> eVar1;
  SSL_METHOD *meth;
  OPENSSL_STACK *sk;
  X509_NAME *a;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_80;
  UniquePtr<struct_stack_st_X509_NAME> stack;
  UniquePtr<X509_NAME> name_dup;
  UniquePtr<X509_NAME> name;
  AssertionResult gtest_ar_;
  AssertHelper local_50;
  AssertionResult gtest_ar;
  UniquePtr<SSL> ssl;
  UniquePtr<SSL_CTX> ctx;
  UniquePtr<typename_internal::StackTraits<stack_st_X509_NAME>::Type> local_18;
  
  meth = (SSL_METHOD *)TLS_method();
  ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<ssl_ctx_st,_bssl::internal::Deleter,_true,_true>)SSL_CTX_new(meth);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       (tuple<ssl_ctx_st_*,_bssl::internal::Deleter>)
       ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl !=
       (_Head_base<0UL,_ssl_ctx_st_*,_false>)0x0;
  if ((tuple<ssl_ctx_st_*,_bssl::internal::Deleter>)
      ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl ==
      (_Head_base<0UL,_ssl_ctx_st_*,_false>)0x0) {
    testing::Message::Message((Message *)&ssl);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)0x2f5309,"false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&name,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x6c9,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&name,(Message *)&ssl);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&name);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if ((__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)
        ssl._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)0x0) {
      (**(code **)(*(long *)ssl._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    goto LAB_00158988;
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  ssl._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_ssl_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<ssl_st,_bssl::internal::Deleter,_true,_true>)
                 SSL_new((SSL_CTX *)
                         ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       (tuple<ssl_st_*,_bssl::internal::Deleter>)
       ssl._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl != (_Head_base<0UL,_ssl_st_*,_false>)0x0;
  if ((tuple<ssl_st_*,_bssl::internal::Deleter>)
      ssl._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl == (_Head_base<0UL,_ssl_st_*,_false>)0x0)
  {
    testing::Message::Message((Message *)&name);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)0x301297,"false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&name_dup,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x6cb,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&name_dup,(Message *)&name);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&name_dup);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if ((__uniq_ptr_impl<X509_name_st,_bssl::internal::Deleter>)
        name._M_t.super___uniq_ptr_impl<X509_name_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_X509_name_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_X509_name_st_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<X509_name_st,_bssl::internal::Deleter>)0x0) {
      (**(code **)(*(long *)name._M_t.super___uniq_ptr_impl<X509_name_st,_bssl::internal::Deleter>.
                            _M_t.super__Tuple_impl<0UL,_X509_name_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_X509_name_st_*,_false>._M_head_impl + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    name._M_t.super___uniq_ptr_impl<X509_name_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_X509_name_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_X509_name_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<X509_name_st,_bssl::internal::Deleter,_true,_true>)X509_NAME_new();
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ =
         (tuple<X509_name_st_*,_bssl::internal::Deleter>)
         name._M_t.super___uniq_ptr_impl<X509_name_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_X509_name_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_X509_name_st_*,_false>._M_head_impl !=
         (_Head_base<0UL,_X509_name_st_*,_false>)0x0;
    if ((tuple<X509_name_st_*,_bssl::internal::Deleter>)
        name._M_t.super___uniq_ptr_impl<X509_name_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_X509_name_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_X509_name_st_*,_false>._M_head_impl ==
        (_Head_base<0UL,_X509_name_st_*,_false>)0x0) {
      testing::Message::Message((Message *)&name_dup);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)0x2fbae0,"false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x6ce,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
      testing::internal::AssertHelper::operator=((AssertHelper *)&stack,(Message *)&name_dup);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack);
      std::__cxx11::string::~string((string *)&gtest_ar);
      if ((__uniq_ptr_impl<X509_name_st,_bssl::internal::Deleter>)
          name_dup._M_t.super___uniq_ptr_impl<X509_name_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_X509_name_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_X509_name_st_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<X509_name_st,_bssl::internal::Deleter>)0x0) {
        (**(code **)(*(long *)name_dup._M_t.
                              super___uniq_ptr_impl<X509_name_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_X509_name_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_X509_name_st_*,_false>._M_head_impl + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      name_dup._M_t.super___uniq_ptr_impl<X509_name_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_X509_name_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_X509_name_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<X509_name_st,_bssl::internal::Deleter,_true,_true>)
           X509_NAME_dup((X509_NAME *)
                         name._M_t.super___uniq_ptr_impl<X509_name_st,_bssl::internal::Deleter>._M_t
                         .super__Tuple_impl<0UL,_X509_name_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_X509_name_st_*,_false>._M_head_impl);
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar_.success_ =
           (tuple<X509_name_st_*,_bssl::internal::Deleter>)
           name_dup._M_t.super___uniq_ptr_impl<X509_name_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_X509_name_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_X509_name_st_*,_false>._M_head_impl !=
           (_Head_base<0UL,_X509_name_st_*,_false>)0x0;
      if ((tuple<X509_name_st_*,_bssl::internal::Deleter>)
          name_dup._M_t.super___uniq_ptr_impl<X509_name_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_X509_name_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_X509_name_st_*,_false>._M_head_impl ==
          (_Head_base<0UL,_X509_name_st_*,_false>)0x0) {
        testing::Message::Message((Message *)&stack);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"name_dup","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_80,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x6d1,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        testing::internal::AssertHelper::operator=(&local_80,(Message *)&stack);
        testing::internal::AssertHelper::~AssertHelper(&local_80);
        std::__cxx11::string::~string((string *)&gtest_ar);
        if ((__uniq_ptr_impl<stack_st_X509_NAME,_bssl::internal::Deleter>)
            stack._M_t.super___uniq_ptr_impl<stack_st_X509_NAME,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_stack_st_X509_NAME_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_stack_st_X509_NAME_*,_false>._M_head_impl !=
            (__uniq_ptr_impl<stack_st_X509_NAME,_bssl::internal::Deleter>)0x0) {
          (**(code **)(*(long *)stack._M_t.
                                super___uniq_ptr_impl<stack_st_X509_NAME,_bssl::internal::Deleter>.
                                _M_t.
                                super__Tuple_impl<0UL,_stack_st_X509_NAME_*,_bssl::internal::Deleter>
                                .super__Head_base<0UL,_stack_st_X509_NAME_*,_false>._M_head_impl + 8
                      ))();
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        stack._M_t.super___uniq_ptr_impl<stack_st_X509_NAME,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_stack_st_X509_NAME_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_stack_st_X509_NAME_*,_false>._M_head_impl =
             (__uniq_ptr_data<stack_st_X509_NAME,_bssl::internal::Deleter,_true,_true>)
             OPENSSL_sk_new_null();
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ =
             (tuple<stack_st_X509_NAME_*,_bssl::internal::Deleter>)
             stack._M_t.super___uniq_ptr_impl<stack_st_X509_NAME,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_stack_st_X509_NAME_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_stack_st_X509_NAME_*,_false>._M_head_impl !=
             (_Head_base<0UL,_stack_st_X509_NAME_*,_false>)0x0;
        if ((tuple<stack_st_X509_NAME_*,_bssl::internal::Deleter>)
            stack._M_t.super___uniq_ptr_impl<stack_st_X509_NAME,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_stack_st_X509_NAME_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_stack_st_X509_NAME_*,_false>._M_head_impl ==
            (_Head_base<0UL,_stack_st_X509_NAME_*,_false>)0x0) {
          testing::Message::Message((Message *)&local_80);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"stack","false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_50,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x6d4,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
          testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_80);
LAB_00158934:
          this_00 = &gtest_ar_.message_;
          testing::internal::AssertHelper::~AssertHelper(&local_50);
          std::__cxx11::string::~string((string *)&gtest_ar);
          if ((long *)CONCAT44(local_80.data_._4_4_,(int)local_80.data_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_80.data_._4_4_,(int)local_80.data_) + 8))();
          }
        }
        else {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
          local_18._M_t.super___uniq_ptr_impl<X509_name_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_X509_name_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_X509_name_st_*,_false>._M_head_impl =
               name_dup._M_t.super___uniq_ptr_impl<X509_name_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_X509_name_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_X509_name_st_*,_false>._M_head_impl;
          name_dup._M_t.super___uniq_ptr_impl<X509_name_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_X509_name_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_X509_name_st_*,_false>._M_head_impl =
               (__uniq_ptr_data<X509_name_st,_bssl::internal::Deleter,_true,_true>)
               (__uniq_ptr_impl<X509_name_st,_bssl::internal::Deleter>)0x0;
          eVar1 = PushToStack<stack_st_X509_NAME>
                            ((stack_st_X509_NAME *)
                             stack._M_t.
                             super___uniq_ptr_impl<stack_st_X509_NAME,_bssl::internal::Deleter>._M_t
                             .super__Tuple_impl<0UL,_stack_st_X509_NAME_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_stack_st_X509_NAME_*,_false>._M_head_impl,
                             &local_18);
          gtest_ar_.success_ = eVar1;
          gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          std::unique_ptr<X509_name_st,_bssl::internal::Deleter>::~unique_ptr(&local_18);
          if (gtest_ar_.success_ == false) {
            testing::Message::Message((Message *)&local_80);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar,(internal *)&gtest_ar_,
                       (AssertionResult *)"PushToStack(stack.get(), std::move(name_dup))","false",
                       "true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_50,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x6d5,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
            testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_80);
            goto LAB_00158934;
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
          name_list = stack;
          stack._M_t.super___uniq_ptr_impl<stack_st_X509_NAME,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_stack_st_X509_NAME_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_stack_st_X509_NAME_*,_false>._M_head_impl =
               (__uniq_ptr_data<stack_st_X509_NAME,_bssl::internal::Deleter,_true,_true>)
               (__uniq_ptr_impl<stack_st_X509_NAME,_bssl::internal::Deleter>)0x0;
          SSL_set_client_CA_list
                    ((SSL *)ssl._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,
                     (stack_st_X509_NAME *)
                     name_list._M_t.
                     super___uniq_ptr_impl<stack_st_X509_NAME,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_stack_st_X509_NAME_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_stack_st_X509_NAME_*,_false>._M_head_impl);
          sk = (OPENSSL_STACK *)
               SSL_get_client_CA_list
                         ((SSL *)ssl._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                                 _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
          gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          gtest_ar_.success_ = sk != (OPENSSL_STACK *)0x0;
          if (sk == (OPENSSL_STACK *)0x0) {
            testing::Message::Message((Message *)&local_80);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"result",
                       "false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_50,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x6db,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
            testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_80);
            goto LAB_00158934;
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
          local_80.data_._0_4_ = 1;
          gtest_ar_._0_8_ = OPENSSL_sk_num(sk);
          testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                    ((internal *)&gtest_ar,"1u","sk_X509_NAME_num(result)",(uint *)&local_80,
                     (unsigned_long *)&gtest_ar_);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar_);
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl ==
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = *(char **)gtest_ar.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_80,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x6dc,pcVar2);
            testing::internal::AssertHelper::operator=(&local_80,(Message *)&gtest_ar_);
            this_00 = &gtest_ar.message_;
            testing::internal::AssertHelper::~AssertHelper(&local_80);
            if (gtest_ar_._0_8_ != 0) {
              (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
            }
          }
          else {
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar.message_);
            gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
            a = (X509_NAME *)OPENSSL_sk_value(sk,0);
            local_80.data_._0_4_ =
                 X509_NAME_cmp(a,(X509_NAME *)
                                 name._M_t.
                                 super___uniq_ptr_impl<X509_name_st,_bssl::internal::Deleter>._M_t.
                                 super__Tuple_impl<0UL,_X509_name_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_X509_name_st_*,_false>._M_head_impl);
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)&gtest_ar,"0",
                       "X509_NAME_cmp(sk_X509_NAME_value(result, 0), name.get())",(int *)&gtest_ar_,
                       (int *)&local_80);
            if (gtest_ar.success_ == false) {
              testing::Message::Message((Message *)&gtest_ar_);
              if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl ==
                  (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )0x0) {
                pcVar2 = "";
              }
              else {
                pcVar2 = *(char **)gtest_ar.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_80,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x6dd,pcVar2);
              testing::internal::AssertHelper::operator=(&local_80,(Message *)&gtest_ar_);
              testing::internal::AssertHelper::~AssertHelper(&local_80);
              if (gtest_ar_._0_8_ != 0) {
                (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
              }
            }
            this_00 = &gtest_ar.message_;
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(this_00);
        std::unique_ptr<stack_st_X509_NAME,_bssl::internal::Deleter>::~unique_ptr(&stack);
      }
      std::unique_ptr<X509_name_st,_bssl::internal::Deleter>::~unique_ptr(&name_dup);
    }
    std::unique_ptr<X509_name_st,_bssl::internal::Deleter>::~unique_ptr(&name);
  }
  std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr(&ssl);
LAB_00158988:
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr(&ctx);
  return;
}

Assistant:

TEST(SSLTest, ClientCAList) {
  bssl::UniquePtr<SSL_CTX> ctx(SSL_CTX_new(TLS_method()));
  ASSERT_TRUE(ctx);
  bssl::UniquePtr<SSL> ssl(SSL_new(ctx.get()));
  ASSERT_TRUE(ssl);

  bssl::UniquePtr<X509_NAME> name(X509_NAME_new());
  ASSERT_TRUE(name);

  bssl::UniquePtr<X509_NAME> name_dup(X509_NAME_dup(name.get()));
  ASSERT_TRUE(name_dup);

  bssl::UniquePtr<STACK_OF(X509_NAME)> stack(sk_X509_NAME_new_null());
  ASSERT_TRUE(stack);
  ASSERT_TRUE(PushToStack(stack.get(), std::move(name_dup)));

  // |SSL_set_client_CA_list| takes ownership.
  SSL_set_client_CA_list(ssl.get(), stack.release());

  STACK_OF(X509_NAME) *result = SSL_get_client_CA_list(ssl.get());
  ASSERT_TRUE(result);
  ASSERT_EQ(1u, sk_X509_NAME_num(result));
  EXPECT_EQ(0, X509_NAME_cmp(sk_X509_NAME_value(result, 0), name.get()));
}